

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O1

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_close_cb p_Var3;
  uv_close_cb extraout_RAX;
  bool bVar4;
  undefined8 *extraout_RDX;
  uv_handle_t *puVar6;
  uv__queue **ppuVar7;
  uv_udp_t *puVar8;
  int64_t eval_b_13;
  int64_t eval_b_14;
  sockaddr_in addr;
  sockaddr_in addr3;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  uv_udp_send_t req4;
  uv_udp_send_t req3;
  undefined1 auStack_5e8 [40];
  uv__queue *puStack_5c0;
  undefined1 auStack_5b8 [16];
  uv__queue *puStack_5a8;
  uv_close_cb p_Stack_5a0;
  uv__queue *puStack_590;
  undefined1 auStack_588 [16];
  undefined1 local_578 [16];
  sockaddr_in local_568;
  uv_buf_t local_558;
  sockaddr_in local_548;
  sockaddr_in local_538;
  uv_udp_send_t local_528;
  uv_udp_send_t local_3e0;
  uv_udp_send_t local_298;
  uv_udp_send_t local_150;
  long lVar5;
  
  can_recverr = '\x01';
  auStack_588._8_8_ = (uv_loop_t *)0x1de071;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_568);
  local_3e0.data = (void *)(long)iVar1;
  local_528.data = (uv__io_cb)0x0;
  if (local_3e0.data == (void *)0x0) {
    auStack_588._8_8_ = (uv_loop_t *)0x1de0ad;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,&local_538);
    local_3e0.data = (void *)(long)iVar1;
    local_528.data = (uv__io_cb)0x0;
    if (local_3e0.data != (void *)0x0) goto LAB_001de5b7;
    auStack_588._8_8_ = (uv_loop_t *)0x1de0e9;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a5,&local_548);
    local_3e0.data = (void *)(long)iVar1;
    local_528.data = (uv__io_cb)0x0;
    if (local_3e0.data != (void *)0x0) goto LAB_001de5c9;
    auStack_588._8_8_ = (uv_loop_t *)0x1de114;
    puVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1de123;
    iVar1 = uv_timer_init(puVar2,&timer);
    local_3e0.data = (void *)(long)iVar1;
    local_528.data = (uv__io_cb)0x0;
    if (local_3e0.data != (void *)0x0) goto LAB_001de5db;
    auStack_588._8_8_ = (uv_loop_t *)0x1de163;
    iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
    local_3e0.data = (void *)(long)iVar1;
    local_528.data = (uv__io_cb)0x0;
    if (local_3e0.data != (void *)0x0) goto LAB_001de5ed;
    auStack_588._8_8_ = (uv_loop_t *)0x1de18e;
    puVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1de19d;
    iVar1 = uv_udp_init(puVar2,&client);
    local_3e0.data = (void *)(long)iVar1;
    local_528.data = (uv__io_cb)0x0;
    if (local_3e0.data != (void *)0x0) goto LAB_001de5ff;
    auStack_588._8_8_ = (uv_loop_t *)0x1de1d6;
    iVar1 = uv_udp_bind(&client,(sockaddr *)&local_538,0);
    local_3e0.data = (void *)(long)iVar1;
    local_528.data = (uv__io_cb)0x0;
    if (local_3e0.data != (void *)0x0) goto LAB_001de611;
    auStack_588._8_8_ = (uv_loop_t *)0x1de216;
    iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
    local_3e0.data = (void *)(long)iVar1;
    local_528.data = (uv__io_cb)0x0;
    if (local_3e0.data != (void *)0x0) goto LAB_001de623;
    auStack_588._8_8_ = (uv_loop_t *)0x1de24d;
    local_558 = uv_buf_init("PING",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1de281;
    iVar1 = uv_udp_send(&local_3e0,&client,&local_558,1,(sockaddr *)&local_568,send_cb);
    local_528.data = (void *)(long)iVar1;
    local_150.data = (void *)0x0;
    if ((uv__io_cb)local_528.data != (uv__io_cb)0x0) goto LAB_001de635;
    auStack_588._8_8_ = (uv_loop_t *)0x1de2b8;
    local_558 = uv_buf_init("PANG",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1de2e9;
    iVar1 = uv_udp_send(&local_528,&client,&local_558,1,(sockaddr *)&local_568,send_cb);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (void *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de647;
    auStack_588._8_8_ = (uv_loop_t *)0x1de31a;
    puVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1de329;
    iVar1 = uv_udp_init(puVar2,&client2);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (void *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de65c;
    auStack_588._8_8_ = (uv_loop_t *)0x1de36b;
    iVar1 = uv_udp_bind(&client2,(sockaddr *)&local_548,0x20);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (void *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de671;
    auStack_588._8_8_ = (uv_loop_t *)0x1de3b1;
    iVar1 = uv_udp_recv_start(&client2,alloc_cb,recv_cb);
    local_150.data = (void *)(long)iVar1;
    local_298.data = (void *)0x0;
    if (local_150.data != (void *)0x0) goto LAB_001de686;
    auStack_588._8_8_ = (uv_loop_t *)0x1de3ee;
    local_558 = uv_buf_init("PING",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1de422;
    iVar1 = uv_udp_send(&local_150,&client2,&local_558,1,(sockaddr *)&local_568,send_cb_recverr);
    local_298.data = (void *)(long)iVar1;
    local_578._0_8_ = (uv_loop_t *)0x0;
    if (local_298.data != (void *)0x0) goto LAB_001de69b;
    auStack_588._8_8_ = (uv_loop_t *)0x1de457;
    local_558 = uv_buf_init("PANG",4);
    auStack_588._8_8_ = (uv_loop_t *)0x1de48b;
    iVar1 = uv_udp_send(&local_298,&client2,&local_558,1,(sockaddr *)&local_568,send_cb_recverr);
    local_578._0_8_ = SEXT48(iVar1);
    local_578._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_578._0_8_ != (uv_loop_t *)0x0) goto LAB_001de6ab;
    auStack_588._8_8_ = (uv_loop_t *)0x1de4ae;
    puVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1de4b8;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_578._0_8_ = SEXT48(send_cb_called);
    local_578._8_8_ = (uv_loop_t *)0x4;
    if ((uv_loop_t *)local_578._0_8_ != (uv_loop_t *)0x4) goto LAB_001de6b8;
    local_578._0_8_ = SEXT48(recv_cb_called);
    local_578._8_8_ = SEXT48(alloc_cb_called);
    if (local_578._0_8_ != local_578._8_8_) goto LAB_001de6c5;
    local_578._0_8_ = (uv_loop_t *)0x1;
    local_578._8_8_ = SEXT48(timer_cb_called);
    if ((uv_loop_t *)local_578._8_8_ != (uv_loop_t *)0x1) goto LAB_001de6d2;
    local_578._0_8_ = SEXT48(close_cb_called);
    local_578._8_8_ = (uv_loop_t *)0x3;
    if ((uv_loop_t *)local_578._0_8_ != (uv_loop_t *)0x3) goto LAB_001de6df;
    auStack_588._8_8_ = (uv_loop_t *)0x1de54c;
    puVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1de560;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    auStack_588._8_8_ = (uv_loop_t *)0x1de56a;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_578._0_8_ = (uv_loop_t *)0x0;
    auStack_588._8_8_ = (uv_loop_t *)0x1de577;
    puVar2 = uv_default_loop();
    auStack_588._8_8_ = (uv_loop_t *)0x1de57f;
    iVar1 = uv_loop_close(puVar2);
    local_578._8_8_ = SEXT48(iVar1);
    if (local_578._0_8_ == local_578._8_8_) {
      auStack_588._8_8_ = (uv_loop_t *)0x1de59a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_588._8_8_ = (uv_loop_t *)0x1de5b7;
    run_test_udp_send_unreachable_cold_1();
LAB_001de5b7:
    auStack_588._8_8_ = (uv_loop_t *)0x1de5c9;
    run_test_udp_send_unreachable_cold_2();
LAB_001de5c9:
    auStack_588._8_8_ = (uv_loop_t *)0x1de5db;
    run_test_udp_send_unreachable_cold_3();
LAB_001de5db:
    auStack_588._8_8_ = (uv_loop_t *)0x1de5ed;
    run_test_udp_send_unreachable_cold_4();
LAB_001de5ed:
    auStack_588._8_8_ = (uv_loop_t *)0x1de5ff;
    run_test_udp_send_unreachable_cold_5();
LAB_001de5ff:
    auStack_588._8_8_ = (uv_loop_t *)0x1de611;
    run_test_udp_send_unreachable_cold_6();
LAB_001de611:
    auStack_588._8_8_ = (uv_loop_t *)0x1de623;
    run_test_udp_send_unreachable_cold_7();
LAB_001de623:
    auStack_588._8_8_ = (uv_loop_t *)0x1de635;
    run_test_udp_send_unreachable_cold_8();
LAB_001de635:
    auStack_588._8_8_ = (uv_loop_t *)0x1de647;
    run_test_udp_send_unreachable_cold_9();
LAB_001de647:
    auStack_588._8_8_ = (uv_loop_t *)0x1de65c;
    run_test_udp_send_unreachable_cold_10();
LAB_001de65c:
    auStack_588._8_8_ = (uv_loop_t *)0x1de671;
    run_test_udp_send_unreachable_cold_11();
LAB_001de671:
    auStack_588._8_8_ = (uv_loop_t *)0x1de686;
    run_test_udp_send_unreachable_cold_12();
LAB_001de686:
    auStack_588._8_8_ = (uv_loop_t *)0x1de69b;
    run_test_udp_send_unreachable_cold_13();
LAB_001de69b:
    auStack_588._8_8_ = (uv_loop_t *)0x1de6ab;
    run_test_udp_send_unreachable_cold_14();
LAB_001de6ab:
    auStack_588._8_8_ = (uv_loop_t *)0x1de6b8;
    run_test_udp_send_unreachable_cold_15();
LAB_001de6b8:
    auStack_588._8_8_ = (uv_loop_t *)0x1de6c5;
    run_test_udp_send_unreachable_cold_16();
LAB_001de6c5:
    auStack_588._8_8_ = (uv_loop_t *)0x1de6d2;
    run_test_udp_send_unreachable_cold_17();
LAB_001de6d2:
    auStack_588._8_8_ = (uv_loop_t *)0x1de6df;
    run_test_udp_send_unreachable_cold_18();
LAB_001de6df:
    auStack_588._8_8_ = (uv_loop_t *)0x1de6ec;
    run_test_udp_send_unreachable_cold_19();
  }
  puVar8 = (uv_udp_t *)local_578;
  puVar6 = (uv_handle_t *)(local_578 + 8);
  auStack_588._8_8_ = timer_cb;
  run_test_udp_send_unreachable_cold_20();
  if (puVar8 == (uv_udp_t *)&timer) {
    timer_cb_called = timer_cb_called + 1;
    auStack_588._0_8_ = (uv_handle_t *)0x1de71f;
    uv_close((uv_handle_t *)&client,close_cb);
    if (can_recverr == '\x01') {
      auStack_588._0_8_ = (uv_handle_t *)0x1de73b;
      uv_close((uv_handle_t *)&client2,close_cb);
    }
    uv_close((uv_handle_t *)&timer,close_cb);
    return extraout_EAX;
  }
  auStack_588._0_8_ = alloc_cb;
  timer_cb_cold_1();
  bVar4 = puVar8 == &client2 || puVar8 == &client;
  lVar5 = CONCAT71(0x10390,bVar4);
  auStack_588._0_8_ = ZEXT18(bVar4);
  puStack_590 = (uv__queue *)0x0;
  if ((uv_handle_t *)auStack_588._0_8_ == (uv_handle_t *)0x0) {
    p_Stack_5a0 = (uv_close_cb)0x1de7d7;
    alloc_cb_cold_2();
  }
  else {
    puStack_590 = (uv__queue *)0x10000;
    auStack_588._0_8_ = puVar6;
    if ((long)puVar6 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      alloc_cb_called = alloc_cb_called + 1;
      return 0x10390e0;
    }
  }
  puVar8 = (uv_udp_t *)auStack_588;
  ppuVar7 = &puStack_590;
  p_Stack_5a0 = recv_cb;
  alloc_cb_cold_1();
  p_Var3 = (uv_close_cb)(ulong)(puVar8 == &client2 || puVar8 == &client);
  puStack_5a8 = (uv__queue *)0x0;
  p_Stack_5a0 = p_Var3;
  if (p_Var3 == (uv_close_cb)0x0) {
    ppuVar7 = &puStack_5a8;
    auStack_5b8._0_8_ = (uv_handle_t *)0x1de853;
    recv_cb_cold_4();
LAB_001de853:
    iVar1 = (int)ppuVar7;
    auStack_5b8._0_8_ = (uv_handle_t *)0x1de858;
    recv_cb_cold_3();
  }
  else {
    recv_cb_called = recv_cb_called + 1;
    if ((long)ppuVar7 < 0) goto LAB_001de853;
    if (ppuVar7 != (uv__queue **)0x0) {
      if (lVar5 != 0) goto LAB_001de83f;
      auStack_5b8._0_8_ = (uv_handle_t *)0x1de83a;
      recv_cb_cold_1();
      p_Var3 = extraout_RAX;
    }
    iVar1 = (int)ppuVar7;
    if (lVar5 == 0) {
LAB_001de83f:
      return (int)p_Var3;
    }
  }
  auStack_5b8._0_8_ = send_cb;
  recv_cb_cold_2();
  if (lVar5 == 0) {
    auStack_5e8._24_8_ = (uv_close_cb)0x1de8ed;
    send_cb_cold_4();
LAB_001de8ed:
    auStack_5e8._24_8_ = (uv_close_cb)0x1de8fc;
    send_cb_cold_1();
    auStack_5e8._24_8_ = (uv_close_cb)0x1de90b;
    send_cb_cold_2();
  }
  else {
    auStack_5b8._0_8_ = SEXT48(iVar1);
    puStack_5c0 = (uv__queue *)0x0;
    if ((uv_handle_t *)auStack_5b8._0_8_ != (uv_handle_t *)0x0) goto LAB_001de8ed;
    bVar4 = *(uv_udp_t **)(lVar5 + 0x48) == &client2 || *(uv_udp_t **)(lVar5 + 0x48) == &client;
    auStack_5b8._0_8_ = ZEXT18(bVar4);
    puStack_5c0 = (uv__queue *)0x0;
    if ((uv_handle_t *)auStack_5b8._0_8_ != (uv_handle_t *)0x0) {
      send_cb_called = send_cb_called + 1;
      return (int)bVar4;
    }
  }
  puVar6 = (uv_handle_t *)auStack_5b8;
  iVar1 = (int)&puStack_5c0;
  auStack_5e8._24_8_ = send_cb_recverr;
  send_cb_cold_3();
  if (puVar6 == (uv_handle_t *)0x0) {
    auStack_5e8._0_8_ = (void *)0x1de979;
    send_cb_recverr_cold_3();
  }
  else {
    if ((iVar1 != -0x6f) && (iVar1 != 0)) goto LAB_001de988;
    bVar4 = puVar6[1].loop == (uv_loop_t *)&client2 || puVar6[1].loop == (uv_loop_t *)&client;
    auStack_5e8._24_8_ = ZEXT18(bVar4);
    auStack_5e8._16_8_ = 0;
    if ((uv_close_cb)auStack_5e8._24_8_ != (uv_close_cb)0x0) {
      send_cb_called = send_cb_called + 1;
      return (int)bVar4;
    }
  }
  puVar6 = (uv_handle_t *)(auStack_5e8 + 0x18);
  auStack_5e8._0_8_ = (void *)0x1de988;
  send_cb_recverr_cold_1();
LAB_001de988:
  auStack_5e8._0_8_ = close_cb;
  send_cb_recverr_cold_2();
  auStack_5e8._0_8_ = (void *)0x1;
  iVar1 = uv_is_closing(puVar6);
  if ((void *)auStack_5e8._0_8_ == (void *)(long)iVar1) {
    close_cb_called = close_cb_called + 1;
    return (int)auStack_5e8._0_8_;
  }
  puVar6 = (uv_handle_t *)auStack_5e8;
  close_cb_cold_1();
  iVar1 = uv_is_closing(puVar6);
  if (iVar1 == 0) {
    uv_close(puVar6,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  struct sockaddr_in addr3;
  uv_udp_send_t req1, req2, req3, req4;
  uv_buf_t buf;
  int r;

#ifdef __linux__
  can_recverr = 1;
#endif

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT_3, &addr3));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT_OK(r);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

  if (can_recverr) {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_OK(r);

    r = uv_udp_bind(&client2,
                    (const struct sockaddr*) &addr3,
                    UV_UDP_LINUX_RECVERR);
    ASSERT_OK(r);

    r = uv_udp_recv_start(&client2, alloc_cb, recv_cb);
    ASSERT_OK(r);

    /* client sends "PING", then "PANG" */
    buf = uv_buf_init("PING", 4);

    r = uv_udp_send(&req3,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_OK(r);

    buf = uv_buf_init("PANG", 4);

    r = uv_udp_send(&req4,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_OK(r);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(send_cb_called, (long)(can_recverr ? 4 : 2));
  ASSERT_EQ(recv_cb_called, alloc_cb_called);
  ASSERT_EQ(1, timer_cb_called);
  ASSERT_EQ(close_cb_called, (long)(can_recverr ? 3 : 2));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}